

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O1

string * __thiscall
CLI::Formatter::make_subcommands_abi_cxx11_
          (string *__return_storage_ptr__,Formatter *this,App *app,AppFormatMode mode)

{
  pointer psVar1;
  pointer pcVar2;
  pointer ppAVar3;
  pointer psVar4;
  __normal_iterator<const_CLI::App_**,_std::vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>_>
  _Var5;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var6;
  ostream *poVar7;
  App **ppAVar8;
  App **ppAVar9;
  pointer pbVar10;
  pointer ppAVar11;
  App *pAVar12;
  string group_key;
  vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_> subcommands_group;
  vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_> subcommands;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  subcmd_groups_seen;
  stringstream out;
  undefined1 local_278 [16];
  undefined1 local_268 [23];
  allocator_type local_251;
  vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_> local_250;
  vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_> local_238;
  AppFormatMode local_21c;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_218;
  string *local_200;
  App *local_1f8;
  Formatter *local_1f0;
  string local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1c0;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  local_21c = mode;
  local_200 = __return_storage_ptr__;
  local_1f0 = this;
  ::std::__cxx11::stringstream::stringstream(local_1b8);
  local_268._0_8_ = (code *)0x0;
  local_268._8_8_ = (code *)0x0;
  local_278._0_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_278._8_8_ = 0;
  std::vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>::vector
            (&local_238,
             (long)(app->subcommands_).
                   super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(app->subcommands_).
                   super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 4,(allocator_type *)&local_218);
  psVar1 = (app->subcommands_).
           super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  ppAVar8 = local_238.super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  for (psVar4 = (app->subcommands_).
                super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
                ._M_impl.super__Vector_impl_data._M_start; psVar4 != psVar1; psVar4 = psVar4 + 1) {
    *ppAVar8 = (psVar4->super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    ppAVar8 = ppAVar8 + 1;
  }
  if (((code *)local_268._0_8_ != (code *)0x0) &&
     (_Var5 = ::std::
              __remove_if<__gnu_cxx::__normal_iterator<CLI::App_const**,std::vector<CLI::App_const*,std::allocator<CLI::App_const*>>>,__gnu_cxx::__ops::_Iter_pred<CLI::App::get_subcommands(std::function<bool(CLI::App_const*)>const&)const::_lambda(CLI::App_const*)_1_>>
                        ((__normal_iterator<const_CLI::App_**,_std::vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>_>
                          )local_238.
                           super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>.
                           _M_impl.super__Vector_impl_data._M_start,
                         (__normal_iterator<const_CLI::App_**,_std::vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>_>
                          )local_238.
                           super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>.
                           _M_impl.super__Vector_impl_data._M_finish,
                         (_Iter_pred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GMLC_TDC[P]HELICS_ThirdParty_helics_external_CLI11_CLI11_hpp:8510:39)>
                          )local_278),
     _Var5._M_current !=
     local_238.super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>._M_impl.
     super__Vector_impl_data._M_finish)) {
    local_238.super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)_Var5;
  }
  local_1f8 = app;
  if ((code *)local_268._0_8_ != (code *)0x0) {
    (*(code *)local_268._0_8_)(local_278,local_278,3);
  }
  ppAVar3 = local_238.super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  local_218.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_218.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_218.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_238.super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_238.super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    ppAVar11 = local_238.super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    do {
      pAVar12 = *ppAVar11;
      if ((pAVar12->name_)._M_string_length == 0) {
        if (((pAVar12->group_)._M_string_length != 0) &&
           (*(pAVar12->group_)._M_dataplus._M_p != '+')) {
          (*(local_1f0->super_FormatterBase)._vptr_FormatterBase[7])(local_278);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    (local_1a8,(char *)local_278._0_8_,local_278._8_8_);
          goto LAB_001987b7;
        }
      }
      else {
        pcVar2 = (pAVar12->group_)._M_dataplus._M_p;
        local_278._0_8_ =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_268;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)local_278,pcVar2,pcVar2 + (pAVar12->group_)._M_string_length);
        if ((local_278._8_8_ != 0) &&
           (_Var6 = ::std::
                    __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_pred<CLI::Formatter::make_subcommands(CLI::App_const*,CLI::AppFormatMode)const::_lambda(std::__cxx11::string)_1_>>
                              (local_218.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start,
                               local_218.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish,local_278),
           _Var6._M_current ==
           local_218.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish)) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&local_218,(value_type *)local_278);
        }
LAB_001987b7:
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_278._0_8_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_268) {
          operator_delete((void *)local_278._0_8_,(ulong)(local_268._0_8_ + 1));
        }
      }
      ppAVar11 = ppAVar11 + 1;
    } while (ppAVar11 != ppAVar3);
  }
  local_1c8 = local_218.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  if (local_218.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_218.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pbVar10 = local_218.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pAVar12 = local_1f8;
    do {
      ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\n",1);
      poVar7 = ::std::__ostream_insert<char,std::char_traits<char>>
                         (local_1a8,(pbVar10->_M_dataplus)._M_p,pbVar10->_M_string_length);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar7,":\n",2);
      local_278._8_8_ = 0;
      local_268._8_8_ =
           std::
           _Function_handler<bool_(const_CLI::App_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/ThirdParty/helics/external/CLI11/CLI11.hpp:10959:13)>
           ::_M_invoke;
      local_268._0_8_ =
           std::
           _Function_handler<bool_(const_CLI::App_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/ThirdParty/helics/external/CLI11/CLI11.hpp:10959:13)>
           ::_M_manager;
      local_278._0_8_ = pbVar10;
      std::vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>::vector
                (&local_250,
                 (long)(pAVar12->subcommands_).
                       super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(pAVar12->subcommands_).
                       super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 4,&local_251);
      psVar1 = (pAVar12->subcommands_).
               super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      ppAVar8 = local_250.super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      for (psVar4 = (pAVar12->subcommands_).
                    super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; psVar4 != psVar1; psVar4 = psVar4 + 1
          ) {
        *ppAVar8 = (psVar4->super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        ppAVar8 = ppAVar8 + 1;
      }
      if (((code *)local_268._0_8_ != (code *)0x0) &&
         (_Var5 = ::std::
                  __remove_if<__gnu_cxx::__normal_iterator<CLI::App_const**,std::vector<CLI::App_const*,std::allocator<CLI::App_const*>>>,__gnu_cxx::__ops::_Iter_pred<CLI::App::get_subcommands(std::function<bool(CLI::App_const*)>const&)const::_lambda(CLI::App_const*)_1_>>
                            ((__normal_iterator<const_CLI::App_**,_std::vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>_>
                              )local_250.
                               super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>
                               ._M_impl.super__Vector_impl_data._M_start,
                             (__normal_iterator<const_CLI::App_**,_std::vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>_>
                              )local_250.
                               super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>
                               ._M_impl.super__Vector_impl_data._M_finish,
                             (_Iter_pred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GMLC_TDC[P]HELICS_ThirdParty_helics_external_CLI11_CLI11_hpp:8510:39)>
                              )local_278),
         _Var5._M_current !=
         local_250.super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>._M_impl.
         super__Vector_impl_data._M_finish)) {
        local_250.super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)_Var5;
      }
      ppAVar9 = local_250.super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      local_1c0 = pbVar10;
      ppAVar8 = local_250.super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      if ((code *)local_268._0_8_ != (code *)0x0) {
        (*(code *)local_268._0_8_)(local_278,local_278,3);
        ppAVar9 = local_250.super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        ppAVar8 = local_250.super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      }
      for (; pAVar12 = local_1f8, ppAVar9 != ppAVar8; ppAVar9 = ppAVar9 + 1) {
        pAVar12 = *ppAVar9;
        if ((pAVar12->name_)._M_string_length != 0) {
          if (local_21c == All) {
            local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
            pcVar2 = (pAVar12->name_)._M_dataplus._M_p;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_1e8,pcVar2,pcVar2 + (pAVar12->name_)._M_string_length);
            CLI::App::help((string *)local_278,pAVar12,&local_1e8,Sub);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      (local_1a8,(char *)local_278._0_8_,local_278._8_8_);
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_278._0_8_
                != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_268) {
              operator_delete((void *)local_278._0_8_,(ulong)(local_268._0_8_ + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
              operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1
                             );
            }
            ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\n",1);
          }
          else {
            (*(local_1f0->super_FormatterBase)._vptr_FormatterBase[6])(local_278,local_1f0,pAVar12);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      (local_1a8,(char *)local_278._0_8_,local_278._8_8_);
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_278._0_8_
                != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_268) {
              operator_delete((void *)local_278._0_8_,(ulong)(local_268._0_8_ + 1));
            }
          }
        }
      }
      if (local_250.super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>._M_impl.
          super__Vector_impl_data._M_start != (App **)0x0) {
        operator_delete(local_250.
                        super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_250.
                              super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_250.
                              super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      pbVar10 = local_1c0 + 1;
    } while (pbVar10 != local_1c8);
  }
  ::std::__cxx11::stringbuf::str();
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_218);
  if (local_238.super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>._M_impl.
      super__Vector_impl_data._M_start != (App **)0x0) {
    operator_delete(local_238.
                    super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_238.
                          super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_238.
                          super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  ::std::__cxx11::stringstream::~stringstream(local_1b8);
  ::std::ios_base::~ios_base(local_138);
  return local_200;
}

Assistant:

CLI11_INLINE std::string Formatter::make_subcommands(const App *app, AppFormatMode mode) const {
    std::stringstream out;

    std::vector<const App *> subcommands = app->get_subcommands({});

    // Make a list in definition order of the groups seen
    std::vector<std::string> subcmd_groups_seen;
    for(const App *com : subcommands) {
        if(com->get_name().empty()) {
            if(!com->get_group().empty() && com->get_group().front() != '+') {
                out << make_expanded(com);
            }
            continue;
        }
        std::string group_key = com->get_group();
        if(!group_key.empty() &&
           std::find_if(subcmd_groups_seen.begin(), subcmd_groups_seen.end(), [&group_key](std::string a) {
               return detail::to_lower(a) == detail::to_lower(group_key);
           }) == subcmd_groups_seen.end())
            subcmd_groups_seen.push_back(group_key);
    }

    // For each group, filter out and print subcommands
    for(const std::string &group : subcmd_groups_seen) {
        out << "\n" << group << ":\n";
        std::vector<const App *> subcommands_group = app->get_subcommands(
            [&group](const App *sub_app) { return detail::to_lower(sub_app->get_group()) == detail::to_lower(group); });
        for(const App *new_com : subcommands_group) {
            if(new_com->get_name().empty())
                continue;
            if(mode != AppFormatMode::All) {
                out << make_subcommand(new_com);
            } else {
                out << new_com->help(new_com->get_name(), AppFormatMode::Sub);
                out << "\n";
            }
        }
    }

    return out.str();
}